

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  Curl_cfilter *pCVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  Curl_cfilter **ppCVar5;
  
  if (data->conn != (connectdata *)0x0) {
    ppCVar5 = data->conn->cfilter + sockindex;
    while (pCVar1 = *ppCVar5, pCVar1 != (Curl_cfilter *)0x0) {
      if ((pCVar1->cft == &Curl_cft_ssl) || (pCVar1->cft == &Curl_cft_ssl_proxy)) {
        plVar2 = (long *)pCVar1->ctx;
        lVar3 = plVar2[9];
        plVar2[9] = (long)data;
        pvVar4 = (void *)(**(code **)(*plVar2 + 0x68))(plVar2,info);
        *(long *)((long)pCVar1->ctx + 0x48) = lVar3;
        return pvVar4;
      }
      ppCVar5 = &pCVar1->next;
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct ssl_connect_data *connssl = cf->ctx;
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = connssl->ssl_impl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}